

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_do_read_interlace
               (png_row_infop row_info,png_bytep row,int pass,png_uint_32 transformations)

{
  byte bVar1;
  png_uint_32 pVar2;
  uint uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  png_bytep __dest;
  uint uVar13;
  png_bytep __src;
  byte *pbVar14;
  bool bVar15;
  png_byte v [8];
  undefined1 local_38 [8];
  
  if (row_info != (png_row_infop)0x0 && row != (png_bytep)0x0) {
    pVar2 = row_info->width;
    uVar13 = png_do_read_interlace::png_pass_inc[pass];
    uVar9 = uVar13 * pVar2;
    bVar1 = row_info->pixel_depth;
    if (bVar1 == 4) {
      uVar8 = pVar2 * 4 & 4;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar3 = uVar9 * 4 & 4;
        uVar10 = 4;
        uVar11 = 0;
        iVar12 = 4;
      }
      else {
        uVar8 = uVar8 ^ 4;
        uVar3 = (~uVar9 & 1) << 2;
        iVar12 = -4;
        uVar10 = 0;
        uVar11 = 4;
      }
      if (row_info->width != 0) {
        pbVar14 = row + (pVar2 - 1 >> 1);
        pbVar5 = row + (uVar9 - 1 >> 1);
        uVar7 = 1;
        if (1 < (int)uVar13) {
          uVar7 = uVar13;
        }
        uVar13 = 0;
        do {
          bVar1 = *pbVar14;
          uVar6 = uVar7;
          do {
            *pbVar5 = (byte)((bVar1 >> ((byte)uVar8 & 0x1f) & 0xf) << ((byte)uVar3 & 0x1f)) |
                      (byte)(0xf0f >> (4 - (byte)uVar3 & 0x1f)) & *pbVar5;
            bVar15 = uVar3 == uVar10;
            uVar3 = uVar3 + iVar12;
            if (bVar15) {
              uVar3 = uVar11;
            }
            pbVar5 = pbVar5 + -(ulong)bVar15;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          bVar15 = uVar8 == uVar10;
          uVar8 = uVar8 + iVar12;
          if (bVar15) {
            uVar8 = uVar11;
          }
          pbVar14 = pbVar14 + -(ulong)bVar15;
          uVar13 = uVar13 + 1;
        } while (uVar13 < row_info->width);
      }
    }
    else if (bVar1 == 2) {
      uVar8 = pVar2 * 2 + 6 & 6;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar8 = uVar8 ^ 6;
        uVar3 = ~(uVar9 * 2 + 6);
        iVar12 = 2;
        uVar10 = 6;
        uVar11 = 0;
      }
      else {
        uVar3 = uVar9 * 2 + 6;
        iVar12 = -2;
        uVar10 = 0;
        uVar11 = 6;
      }
      uVar3 = uVar3 & 6;
      if (row_info->width != 0) {
        pbVar14 = row + (pVar2 - 1 >> 2);
        pbVar5 = row + (uVar9 - 1 >> 2);
        uVar7 = 1;
        if (1 < (int)uVar13) {
          uVar7 = uVar13;
        }
        uVar13 = 0;
        do {
          bVar1 = *pbVar14;
          uVar6 = uVar7;
          do {
            *pbVar5 = (byte)((bVar1 >> ((byte)uVar8 & 0x1f) & 3) << ((byte)uVar3 & 0x1f)) |
                      (byte)(0x3f3f >> (6 - (byte)uVar3 & 0x1f)) & *pbVar5;
            bVar15 = uVar3 == uVar10;
            uVar3 = uVar3 + iVar12;
            if (bVar15) {
              uVar3 = uVar11;
            }
            pbVar5 = pbVar5 + -(ulong)bVar15;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          bVar15 = uVar8 == uVar10;
          uVar8 = uVar8 + iVar12;
          if (bVar15) {
            uVar8 = uVar11;
          }
          pbVar14 = pbVar14 + -(ulong)bVar15;
          uVar13 = uVar13 + 1;
        } while (uVar13 < row_info->width);
      }
    }
    else if (bVar1 == 1) {
      uVar8 = pVar2 - 1 & 7;
      if ((transformations >> 0x10 & 1) == 0) {
        uVar8 = uVar8 ^ 7;
        uVar10 = 0;
        uVar11 = 7;
        iVar12 = 1;
        uVar3 = -uVar9;
      }
      else {
        uVar10 = 7;
        uVar11 = 0;
        iVar12 = -1;
        uVar3 = uVar9 - 1;
      }
      uVar3 = uVar3 & 7;
      if (row_info->width != 0) {
        pbVar14 = row + (pVar2 - 1 >> 3);
        pbVar5 = row + (uVar9 - 1 >> 3);
        uVar7 = 1;
        if (1 < (int)uVar13) {
          uVar7 = uVar13;
        }
        uVar13 = 0;
        do {
          bVar1 = *pbVar14;
          uVar6 = uVar7;
          do {
            *pbVar5 = ((bVar1 >> (uVar8 & 0x1f) & 1) != 0) << ((byte)uVar3 & 0x1f) |
                      (byte)(0x7f7f >> (7 - (byte)uVar3 & 0x1f)) & *pbVar5;
            bVar15 = uVar3 == uVar11;
            uVar3 = uVar3 + iVar12;
            if (bVar15) {
              uVar3 = uVar10;
            }
            pbVar5 = pbVar5 + -(ulong)bVar15;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          bVar15 = uVar8 == uVar11;
          uVar8 = uVar8 + iVar12;
          if (bVar15) {
            uVar8 = uVar10;
          }
          pbVar14 = pbVar14 + -(ulong)bVar15;
          uVar13 = uVar13 + 1;
        } while (uVar13 < row_info->width);
      }
    }
    else if (row_info->width != 0) {
      uVar4 = (ulong)(bVar1 >> 3);
      __dest = row + (uVar9 - 1) * uVar4;
      __src = row + (pVar2 - 1) * uVar4;
      uVar8 = 1;
      if (1 < (int)uVar13) {
        uVar8 = uVar13;
      }
      uVar13 = 0;
      do {
        memcpy(local_38,__src,uVar4);
        uVar3 = uVar8;
        do {
          memcpy(__dest,local_38,uVar4);
          __dest = __dest + -uVar4;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
        __src = __src + -uVar4;
        uVar13 = uVar13 + 1;
      } while (uVar13 < row_info->width);
    }
    row_info->width = uVar9;
    bVar1 = row_info->pixel_depth;
    if ((ulong)bVar1 < 8) {
      uVar4 = (ulong)bVar1 * (ulong)uVar9 + 7 >> 3;
    }
    else {
      uVar4 = (ulong)(bVar1 >> 3) * (ulong)uVar9;
    }
    row_info->rowbytes = uVar4;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_interlace(png_row_infop row_info, png_bytep row, int pass,
    png_uint_32 transformations /* Because these may affect the byte layout */)
{
   /* Arrays to facilitate easy interlacing - use pass (0 - 6) as index */
   /* Offset to next interlace block */
   static PNG_CONST unsigned int png_pass_inc[7] = {8, 8, 4, 4, 2, 2, 1};

   png_debug(1, "in png_do_read_interlace");
   if (row != NULL && row_info != NULL)
   {
      png_uint_32 final_width;

      final_width = row_info->width * png_pass_inc[pass];

      switch (row_info->pixel_depth)
      {
         case 1:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 3);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 3);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_byte v;
            png_uint_32 i;
            int j;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
                sshift = ((row_info->width + 7) & 0x07);
                dshift = ((final_width + 7) & 0x07);
                s_start = 7;
                s_end = 0;
                s_inc = -1;
            }

            else
#endif
            {
                sshift = 7 - ((row_info->width + 7) & 0x07);
                dshift = 7 - ((final_width + 7) & 0x07);
                s_start = 0;
                s_end = 7;
                s_inc = 1;
            }

            for (i = 0; i < row_info->width; i++)
            {
               v = (png_byte)((*sp >> sshift) & 0x01);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x7f7f >> (7 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 2:
         {
            png_bytep sp = row + (png_uint_32)((row_info->width - 1) >> 2);
            png_bytep dp = row + (png_uint_32)((final_width - 1) >> 2);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 3) & 0x03) << 1);
               dshift = (((final_width + 3) & 0x03) << 1);
               s_start = 6;
               s_end = 0;
               s_inc = -2;
            }

            else
#endif
            {
               sshift = ((3 - ((row_info->width + 3) & 0x03)) << 1);
               dshift = ((3 - ((final_width + 3) & 0x03)) << 1);
               s_start = 0;
               s_end = 6;
               s_inc = 2;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v;
               int j;

               v = (png_byte)((*sp >> sshift) & 0x03);
               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0x3f3f >> (6 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         case 4:
         {
            png_bytep sp = row + (png_size_t)((row_info->width - 1) >> 1);
            png_bytep dp = row + (png_size_t)((final_width - 1) >> 1);
            unsigned int sshift, dshift;
            unsigned int s_start, s_end;
            int s_inc;
            png_uint_32 i;
            int jstop = (int)png_pass_inc[pass];

#ifdef PNG_READ_PACKSWAP_SUPPORTED
            if ((transformations & PNG_PACKSWAP) != 0)
            {
               sshift = (((row_info->width + 1) & 0x01) << 2);
               dshift = (((final_width + 1) & 0x01) << 2);
               s_start = 4;
               s_end = 0;
               s_inc = -4;
            }

            else
#endif
            {
               sshift = ((1 - ((row_info->width + 1) & 0x01)) << 2);
               dshift = ((1 - ((final_width + 1) & 0x01)) << 2);
               s_start = 0;
               s_end = 4;
               s_inc = 4;
            }

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v = (png_byte)((*sp >> sshift) & 0x0f);
               int j;

               for (j = 0; j < jstop; j++)
               {
                  unsigned int tmp = *dp & (0xf0f >> (4 - dshift));
                  tmp |= (unsigned int)(v << dshift);
                  *dp = (png_byte)(tmp & 0xff);

                  if (dshift == s_end)
                  {
                     dshift = s_start;
                     dp--;
                  }

                  else
                     dshift = (unsigned int)((int)dshift + s_inc);
               }

               if (sshift == s_end)
               {
                  sshift = s_start;
                  sp--;
               }

               else
                  sshift = (unsigned int)((int)sshift + s_inc);
            }
            break;
         }

         default:
         {
            png_size_t pixel_bytes = (row_info->pixel_depth >> 3);

            png_bytep sp = row + (png_size_t)(row_info->width - 1)
                * pixel_bytes;

            png_bytep dp = row + (png_size_t)(final_width - 1) * pixel_bytes;

            int jstop = (int)png_pass_inc[pass];
            png_uint_32 i;

            for (i = 0; i < row_info->width; i++)
            {
               png_byte v[8]; /* SAFE; pixel_depth does not exceed 64 */
               int j;

               memcpy(v, sp, pixel_bytes);

               for (j = 0; j < jstop; j++)
               {
                  memcpy(dp, v, pixel_bytes);
                  dp -= pixel_bytes;
               }

               sp -= pixel_bytes;
            }
            break;
         }
      }

      row_info->width = final_width;
      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, final_width);
   }
#ifndef PNG_READ_PACKSWAP_SUPPORTED
   PNG_UNUSED(transformations)  /* Silence compiler warning */
#endif
}